

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O1

int __thiscall
CDesign::GetWireInOverFlowBoundary
          (CDesign *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pWireList)

{
  CLayer *this_00;
  int iLayer;
  
  if ((this->super_CBBox).m_cMinZ < (this->super_CBBox).m_cMaxZ) {
    iLayer = 0;
    do {
      iLayer = iLayer + 1;
      this_00 = GetLayer(this,iLayer);
      CLayer::GetWireInOverFlowBoundary(this_00,pWireList);
    } while (iLayer < (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ);
  }
  return (int)(pWireList->_M_ht)._M_num_elements;
}

Assistant:

int CDesign::GetWireInOverFlowBoundary(hash_map<ADDRESS,int>* pWireList)
{
	for (int i=LAYER_METAL1;i<=T();++i)	GetLayer(i)->GetWireInOverFlowBoundary(pWireList);

	return	pWireList->size();
}